

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.h
# Opt level: O0

void install_symbol(void *context,fb_symbol_t *sym)

{
  char *pcVar1;
  int iVar2;
  uint uVar3;
  fb_compound_type_t *pfVar4;
  char *pcVar5;
  fb_compound_type_t *ct;
  char *name;
  char *s;
  fb_ref_t *pfStack_28;
  int n;
  fb_ref_t *scope_name;
  catalog_t *catalog;
  fb_symbol_t *sym_local;
  void *context_local;
  
  pfVar4 = get_compound_if_visible(*(fb_schema_t **)((long)context + 0x58),sym);
  if (pfVar4 != (fb_compound_type_t *)0x0) {
    pcVar1 = *(char **)((long)context + 0x50);
    name = pcVar1;
    if (*context != 0) {
      for (pfStack_28 = pfVar4->scope->name; pfStack_28 != (fb_ref_t *)0x0;
          pfStack_28 = pfStack_28->link) {
        iVar2 = (int)pfStack_28->ident->len;
        memcpy(name,pfStack_28->ident->text,(long)iVar2);
        pcVar5 = name + iVar2;
        name = pcVar5 + 1;
        *pcVar5 = '.';
      }
    }
    iVar2 = (int)sym->ident->len;
    memcpy(name,sym->ident->text,(long)iVar2);
    name[iVar2] = '\0';
    *(char **)((long)context + 0x50) = name + iVar2 + 1;
    uVar3 = (uint)sym->kind;
    if (uVar3 < 2) {
      **(undefined8 **)((long)context + 0x38) = sym;
      *(char **)(*(long *)((long)context + 0x38) + 8) = pcVar1;
      *(long *)((long)context + 0x38) = *(long *)((long)context + 0x38) + 0x10;
    }
    else if (uVar3 == 2) {
      **(undefined8 **)((long)context + 0x48) = sym;
      *(char **)(*(long *)((long)context + 0x48) + 8) = pcVar1;
      *(long *)((long)context + 0x48) = *(long *)((long)context + 0x48) + 0x10;
    }
    else if (uVar3 - 3 < 2) {
      **(undefined8 **)((long)context + 0x40) = sym;
      *(char **)(*(long *)((long)context + 0x40) + 8) = pcVar1;
      *(long *)((long)context + 0x40) = *(long *)((long)context + 0x40) + 0x10;
    }
  }
  return;
}

Assistant:

static void install_symbol(void *context, fb_symbol_t *sym)
{
    catalog_t *catalog = context;
    fb_ref_t *scope_name;
    int n = 0;
    char *s, *name;
    fb_compound_type_t *ct;
    
    if (!(ct = get_compound_if_visible(catalog->schema, sym))) {
        return;
    }

    s = catalog->next_name;
    name = s;
    if (catalog->qualify_names) {
        scope_name = ct->scope->name;
        while (scope_name) {
            n = (int)scope_name->ident->len;
            memcpy(s, scope_name->ident->text, (size_t)n);
            s += n;
            *s++ = '.';
            scope_name = scope_name->link;
        }
    }
    n = (int)sym->ident->len;
    memcpy(s, sym->ident->text, (size_t)n);
    s += n;
    *s++ = '\0';
    catalog->next_name = s;

    switch (sym->kind) {
    case fb_is_struct:
    case fb_is_table:
        catalog->next_object->ct = (fb_compound_type_t *)sym;
        catalog->next_object->name = name;
        catalog->next_object++;
        break;
    case fb_is_union:
    case fb_is_enum:
        catalog->next_enum->ct = (fb_compound_type_t *)sym;
        catalog->next_enum->name = name;
        catalog->next_enum++;
        break;
    case fb_is_rpc_service:
        catalog->next_service->ct = (fb_compound_type_t *)sym;
        catalog->next_service->name = name;
        catalog->next_service++;
        break;
    default: break;
    }
}